

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rle.cpp
# Opt level: O0

void duckdb::RLECompress<unsigned_long,true>
               (CompressionState *state_p,Vector *scan_vector,idx_t count)

{
  UnifiedVectorFormat vdata;
  RLECompressState<unsigned_long,_true> *state;
  CompressionState *in_stack_ffffffffffffff80;
  UnifiedVectorFormat *this;
  UnifiedVectorFormat *in_stack_ffffffffffffff90;
  UnifiedVectorFormat *in_stack_ffffffffffffff98;
  RLECompressState<unsigned_long,_true> *in_stack_ffffffffffffffa0;
  
  CompressionState::Cast<duckdb::RLECompressState<unsigned_long,true>>(in_stack_ffffffffffffff80);
  this = (UnifiedVectorFormat *)&stack0xffffffffffffff98;
  UnifiedVectorFormat::UnifiedVectorFormat(in_stack_ffffffffffffff90);
  Vector::ToUnifiedFormat
            ((Vector *)vdata.owned_sel.sel_vector,
             vdata.validity.super_TemplatedValidityMask<unsigned_long>.capacity,
             (UnifiedVectorFormat *)
             vdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
             super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi);
  RLECompressState<unsigned_long,_true>::Append
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,(idx_t)in_stack_ffffffffffffff90);
  UnifiedVectorFormat::~UnifiedVectorFormat(this);
  return;
}

Assistant:

void RLECompress(CompressionState &state_p, Vector &scan_vector, idx_t count) {
	auto &state = state_p.Cast<RLECompressState<T, WRITE_STATISTICS>>();
	UnifiedVectorFormat vdata;
	scan_vector.ToUnifiedFormat(count, vdata);

	state.Append(vdata, count);
}